

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O2

bool __thiscall
boost::detail::function::
basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
::assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
          (basic_vtable2<boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
           *this,token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *f,
          function_buffer *functor)

{
  bool bVar1;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> tStack_38;
  
  algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
            (&tStack_38,f);
  bVar1 = assign_to<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>>
                    (this,&tStack_38,functor);
  algorithm::detail::is_any_ofF<char>::~is_any_ofF(&tStack_38.m_Pred);
  return bVar1;
}

Assistant:

bool assign_to(F f, function_buffer& functor) const
        {
          typedef typename get_function_tag<F>::type tag;
          return assign_to(f, functor, tag());
        }